

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *
testing::internal::ActionResultHolder<std::optional<n_e_s::core::Pixel>>::
PerformDefaultAction<std::optional<n_e_s::core::Pixel>()>
          (FunctionMocker<std::optional<n_e_s::core::Pixel>_()> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  Result value;
  ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *this;
  Wrapper result;
  undefined1 local_26 [6];
  string *local_20;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<std::optional<n_e_s::core::Pixel>_()> *func_mocker_local;
  
  local_20 = call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)func_mocker;
  this = (ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *)operator_new(0x10);
  value = FunctionMocker<std::optional<n_e_s::core::Pixel>_()>::PerformDefaultAction
                    ((FunctionMocker<std::optional<n_e_s::core::Pixel>_()> *)args_local,
                     (ArgumentTuple *)call_description_local,local_20);
  ReferenceOrValueWrapper<std::optional<n_e_s::core::Pixel>_>::ReferenceOrValueWrapper
            ((ReferenceOrValueWrapper<std::optional<n_e_s::core::Pixel>_> *)local_26,
             (optional<n_e_s::core::Pixel>)
             value.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
             super__Optional_payload_base<n_e_s::core::Pixel>);
  result.value_.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Pixel>._4_2_ = local_26._4_2_;
  result.value_.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_ = local_26._0_4_;
  ActionResultHolder<std::optional<n_e_s::core::Pixel>_>::ActionResultHolder(this,result);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }